

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::Statistics::Statistics(Statistics *this,Statistics *other14)

{
  int64_t iVar1;
  
  *(undefined ***)this = &PTR__Statistics_024b7c18;
  (this->max)._M_dataplus._M_p = (pointer)&(this->max).field_2;
  (this->max)._M_string_length = 0;
  (this->max).field_2._M_local_buf[0] = '\0';
  (this->min)._M_dataplus._M_p = (pointer)&(this->min).field_2;
  (this->min)._M_string_length = 0;
  (this->min).field_2._M_local_buf[0] = '\0';
  (this->max_value)._M_dataplus._M_p = (pointer)&(this->max_value).field_2;
  (this->max_value)._M_string_length = 0;
  (this->max_value).field_2._M_local_buf[0] = '\0';
  (this->min_value)._M_dataplus._M_p = (pointer)&(this->min_value).field_2;
  (this->min_value)._M_string_length = 0;
  (this->min_value).field_2._M_local_buf[0] = '\0';
  this->__isset = (_Statistics__isset)0x0;
  std::__cxx11::string::_M_assign((string *)&this->max);
  std::__cxx11::string::_M_assign((string *)&this->min);
  iVar1 = other14->distinct_count;
  this->null_count = other14->null_count;
  this->distinct_count = iVar1;
  std::__cxx11::string::_M_assign((string *)&this->max_value);
  std::__cxx11::string::_M_assign((string *)&this->min_value);
  this->is_max_value_exact = other14->is_max_value_exact;
  this->is_min_value_exact = other14->is_min_value_exact;
  this->__isset = other14->__isset;
  return;
}

Assistant:

Statistics::Statistics(const Statistics& other14) {
  max = other14.max;
  min = other14.min;
  null_count = other14.null_count;
  distinct_count = other14.distinct_count;
  max_value = other14.max_value;
  min_value = other14.min_value;
  is_max_value_exact = other14.is_max_value_exact;
  is_min_value_exact = other14.is_min_value_exact;
  __isset = other14.__isset;
}